

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::setup_for_solve(HModel *this)

{
  pointer piVar1;
  int *Astart_;
  int *Aindex_;
  double *Avalue_;
  long lVar2;
  int iVar3;
  timeval tv;
  
  HTimer::reset(&this->timer);
  if (this->numRow != 0) {
    initRandomVec(this);
    if (this->mlFg_haveBasis == 0) {
      replaceWithLogicalBasis(this);
    }
    else {
      this->numBasicLogicals = 0;
      if (0 < (long)this->numRow) {
        piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = 0;
        iVar3 = 0;
        do {
          if (this->numCol <= piVar1[lVar2]) {
            iVar3 = iVar3 + 1;
            this->numBasicLogicals = iVar3;
          }
          lVar2 = lVar2 + 1;
        } while (this->numRow != lVar2);
      }
    }
    if ((this->mlFg_haveMatrixColWise == 0) || (this->mlFg_haveMatrixRowWise == 0)) {
      Astart_ = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      Aindex_ = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      Avalue_ = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (this->numBasicLogicals == this->numRow) {
        HMatrix::setup_lgBs(&this->matrix,this->numCol,this->numBasicLogicals,Astart_,Aindex_,
                            Avalue_);
      }
      else {
        HMatrix::setup(&this->matrix,this->numCol,this->numRow,Astart_,Aindex_,Avalue_,
                       (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
      }
      this->mlFg_haveMatrixColWise = 1;
      this->mlFg_haveMatrixRowWise = 1;
    }
    if (this->mlFg_haveFactorArrays == 0) {
      HFactor::setup(&this->factor,this->numCol,this->numRow,
                     (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,1);
      this->mlFg_haveFactorArrays = 1;
      this->limitUpdate = 5000;
    }
    gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
    this->totalTime =
         (((double)tv.tv_usec / 1000000.0 + (double)tv.tv_sec) - (this->timer).startTime) +
         this->totalTime;
  }
  return;
}

Assistant:

void HModel::setup_for_solve() {
  timer.reset();
  if (numRow == 0) return;
  
  // Initialise the real and integer random vectors
  initRandomVec();

  //  mlFg_Report();cout<<flush;
  //  printf("In setup_fromModelLgBs: mlFg_haveBasis = %d \n", mlFg_haveBasis);cout<<flush;
  if (mlFg_haveBasis) {
    // Model has a basis so just count the number of basic logicals
    setup_numBasicLogicals(); 
  }
  else {
    // Model has no basis: set up a logical basis then populate (where
    // possible) work* arrays
    replaceWithLogicalBasis();
    //    printf("Called replaceWithLogicalBasis\n");cout<<flush;
  }

  if (!(mlFg_haveMatrixColWise && mlFg_haveMatrixRowWise)) {
    // Make a copy of col-wise matrix for HMatrix and create its row-wise matrix
    if (numBasicLogicals == numRow) {
      matrix.setup_lgBs(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0]);
      //      printf("Called matrix.setup_lgBs\n");cout<<flush;
    } else {
      matrix.setup(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0], &nonbasicFlag[0]);
      //      printf("Called matrix.setup\n");cout<<flush;
    }
    //Indicate that there is a colum-wise and row-wise copy of the
    //matrix: can't be done in matrix.setup_lgBs
    mlFg_haveMatrixColWise = 1;
    mlFg_haveMatrixRowWise = 1;
  }

  if (!mlFg_haveFactorArrays) {
    // Initialise factor arrays, passing &basicIndex[0] so that its
    // address can be copied to the internal Factor pointer
    factor.setup(numCol, numRow, &Astart[0], &Aindex[0], &Avalue[0], &basicIndex[0]);
    // Indicate that the model has factor arrays: can't be done in factor.setup
    mlFg_haveFactorArrays = 1;
    limitUpdate = 5000;
  }

  // Save the input time
  totalTime += timer.getTime();
}